

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O3

void __thiscall
wabt::anon_unknown_1::BinaryWriterSpec::WriteConstVector(BinaryWriterSpec *this,ConstVector *consts)

{
  v128 *this_00;
  Enum EVar1;
  unsigned_short uVar2;
  int iVar3;
  uint uVar4;
  unsigned_long uVar5;
  ulong uVar6;
  ExpectedNan EVar7;
  char *pcVar8;
  ulong uVar9;
  Const *this_01;
  Stream *pSVar10;
  pointer pCVar11;
  ulong uVar12;
  long local_68;
  Type local_58;
  string local_50;
  
  Stream::Writef(this->json_stream_,"[");
  pCVar11 = (consts->super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((consts->super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>)._M_impl.
      super__Vector_impl_data._M_finish != pCVar11) {
    local_68 = 0;
    uVar12 = 0;
    do {
      Stream::Writef(this->json_stream_,"{");
      Stream::Writef(this->json_stream_,"\"%s\": ","type");
      EVar1 = pCVar11[uVar12].type_.enum_;
      if (0x10 < (uint)(EVar1 + 0x11)) {
switchD_0014c7a6_caseD_fffffff1:
        abort();
      }
      this_01 = pCVar11 + uVar12;
      switch(EVar1) {
      case ExternRef:
        pSVar10 = this->json_stream_;
        pcVar8 = "externref";
        goto LAB_0014c826;
      case FuncRef:
        pSVar10 = this->json_stream_;
        pcVar8 = "funcref";
LAB_0014c826:
        Stream::Writef(pSVar10,"\"%s\"",pcVar8);
        Stream::Writef(this->json_stream_,", ");
        Stream::Writef(this->json_stream_,"\"%s\": ","value");
        WriteRefBits((BinaryWriterSpec *)this->json_stream_,*(uintptr_t *)(this_01->data_).v);
        break;
      default:
        goto switchD_0014c7a6_caseD_fffffff1;
      case V128:
        Stream::Writef(this->json_stream_,"\"%s\"","v128");
        Stream::Writef(this->json_stream_,", ");
        Stream::Writef(this->json_stream_,"\"%s\": ","lane_type");
        if ((this_01->type_).enum_ != V128) {
LAB_0014cc5c:
          __assert_fail("type_ == Type::V128",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/ir.h"
                        ,0x6a,"Type wabt::Const::lane_type() const");
        }
        local_58 = this_01->lane_type_;
        Type::GetName_abi_cxx11_(&local_50,&local_58);
        Stream::Writef(this->json_stream_,"\"%s\"",local_50._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        Stream::Writef(this->json_stream_,", ");
        Stream::Writef(this->json_stream_,"\"%s\": ","value");
        Stream::Writef(this->json_stream_,"[");
        iVar3 = Const::lane_count(this_01);
        if (0 < iVar3) {
          this_00 = &this_01->data_;
          uVar6 = 0;
          do {
            if ((this_01->type_).enum_ != V128) goto LAB_0014cc5c;
            iVar3 = (int)uVar6;
            switch((this_01->lane_type_).enum_) {
            case I16:
              pSVar10 = this->json_stream_;
              uVar2 = v128::To<unsigned_short>(this_00,iVar3);
              uVar9 = (ulong)uVar2;
              goto LAB_0014ca65;
            case I8:
              if (0xf < uVar6) {
                __assert_fail("(lane + 1) * sizeof(T) <= sizeof(v)",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/common.h"
                              ,0x8b,"T v128::To(int) const [T = unsigned char]");
              }
              pSVar10 = this->json_stream_;
              uVar9 = (ulong)(pCVar11->data_).v[uVar6 + local_68];
              goto LAB_0014ca65;
            default:
              goto switchD_0014c7a6_caseD_fffffff1;
            case F64:
              uVar5 = v128::To<unsigned_long>(this_00,iVar3);
              EVar7 = None;
              if (uVar6 < 4) {
                EVar7 = *(ExpectedNan *)((long)pCVar11->nan_ + uVar6 * 4 + local_68);
              }
              WriteF64((BinaryWriterSpec *)this->json_stream_,uVar5,EVar7);
              break;
            case F32:
              uVar4 = v128::To<unsigned_int>(this_00,iVar3);
              EVar7 = None;
              if (uVar6 < 4) {
                EVar7 = *(ExpectedNan *)((long)pCVar11->nan_ + uVar6 * 4 + local_68);
              }
              WriteF32((BinaryWriterSpec *)this->json_stream_,uVar4,EVar7);
              break;
            case I64:
              pSVar10 = this->json_stream_;
              uVar5 = v128::To<unsigned_long>(this_00,iVar3);
              Stream::Writef(pSVar10,"\"%lu\"",uVar5);
              break;
            case I32:
              pSVar10 = this->json_stream_;
              uVar4 = v128::To<unsigned_int>(this_00,iVar3);
              uVar9 = (ulong)uVar4;
LAB_0014ca65:
              Stream::Writef(pSVar10,"\"%u\"",uVar9);
            }
            iVar3 = Const::lane_count(this_01);
            if (uVar6 != iVar3 - 1) {
              Stream::Writef(this->json_stream_,", ");
            }
            uVar6 = uVar6 + 1;
            iVar3 = Const::lane_count(this_01);
          } while ((long)uVar6 < (long)iVar3);
        }
        Stream::Writef(this->json_stream_,"]");
        break;
      case F64:
        Stream::Writef(this->json_stream_,"\"%s\"","f64");
        Stream::Writef(this->json_stream_,", ");
        Stream::Writef(this->json_stream_,"\"%s\": ","value");
        WriteF64((BinaryWriterSpec *)this->json_stream_,*(uint64_t *)(this_01->data_).v,
                 this_01->nan_[0]);
        break;
      case F32:
        Stream::Writef(this->json_stream_,"\"%s\"","f32");
        Stream::Writef(this->json_stream_,", ");
        Stream::Writef(this->json_stream_,"\"%s\": ","value");
        WriteF32((BinaryWriterSpec *)this->json_stream_,*(uint32_t *)(this_01->data_).v,
                 this_01->nan_[0]);
        break;
      case I64:
        Stream::Writef(this->json_stream_,"\"%s\"","i64");
        Stream::Writef(this->json_stream_,", ");
        Stream::Writef(this->json_stream_,"\"%s\": ","value");
        Stream::Writef(this->json_stream_,"\"%lu\"",*(undefined8 *)(this_01->data_).v);
        break;
      case I32:
        Stream::Writef(this->json_stream_,"\"%s\"","i32");
        Stream::Writef(this->json_stream_,", ");
        Stream::Writef(this->json_stream_,"\"%s\": ","value");
        Stream::Writef(this->json_stream_,"\"%u\"",(ulong)*(uint *)(this_01->data_).v);
      }
      Stream::Writef(this->json_stream_,"}");
      pCVar11 = (consts->super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar6 = ((long)(consts->super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>)._M_impl
                     .super__Vector_impl_data._M_finish - (long)pCVar11 >> 4) * -0x3333333333333333;
      if (uVar12 != uVar6 - 1) {
        Stream::Writef(this->json_stream_,", ");
        pCVar11 = (consts->super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar6 = ((long)(consts->super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)pCVar11 >> 4) *
                -0x3333333333333333;
      }
      uVar12 = uVar12 + 1;
      local_68 = local_68 + 0x50;
    } while (uVar12 < uVar6);
  }
  Stream::Writef(this->json_stream_,"]");
  return;
}

Assistant:

void BinaryWriterSpec::WriteConstVector(const ConstVector& consts) {
  json_stream_->Writef("[");
  for (size_t i = 0; i < consts.size(); ++i) {
    const Const& const_ = consts[i];
    WriteConst(const_);
    if (i != consts.size() - 1) {
      WriteSeparator();
    }
  }
  json_stream_->Writef("]");
}